

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O2

bool __thiscall slang::driver::Driver::runFullCompilation(Driver *this,bool quiet)

{
  bool bVar1;
  unique_ptr<slang::ast::Compilation,_std::default_delete<slang::ast::Compilation>_> compilation;
  __uniq_ptr_impl<slang::ast::Compilation,_std::default_delete<slang::ast::Compilation>_> local_20;
  
  createCompilation((Driver *)&stack0xffffffffffffffe0);
  reportCompilation(this,(Compilation *)
                         local_20._M_t.
                         super__Tuple_impl<0UL,_slang::ast::Compilation_*,_std::default_delete<slang::ast::Compilation>_>
                         .super__Head_base<0UL,_slang::ast::Compilation_*,_false>._M_head_impl,quiet
                   );
  runAnalysis(this,(Compilation *)
                   local_20._M_t.
                   super__Tuple_impl<0UL,_slang::ast::Compilation_*,_std::default_delete<slang::ast::Compilation>_>
                   .super__Head_base<0UL,_slang::ast::Compilation_*,_false>._M_head_impl);
  bVar1 = reportDiagnostics(this,quiet);
  std::unique_ptr<slang::ast::Compilation,_std::default_delete<slang::ast::Compilation>_>::
  ~unique_ptr((unique_ptr<slang::ast::Compilation,_std::default_delete<slang::ast::Compilation>_> *)
              &stack0xffffffffffffffe0);
  return bVar1;
}

Assistant:

bool Driver::runFullCompilation(bool quiet) {
    auto compilation = createCompilation();
    reportCompilation(*compilation, quiet);
    runAnalysis(*compilation);
    return reportDiagnostics(quiet);
}